

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_2,_0>::convolveTransitionMatrices
          (BeagleCPUImpl<double,_2,_0> *this,int *firstIndices,int *secondIndices,int *resultIndices
          ,int matrixCount)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  double **ppdVar4;
  double *pdVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  double *pdVar12;
  ulong uVar13;
  ulong uVar14;
  double *pdVar15;
  double *pdVar16;
  double *pdVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  ppdVar4 = this->gTransitionMatrices;
  uVar13 = 0;
  uVar2 = this->kCategoryCount;
  while( true ) {
    if (uVar13 == (uint)(~(matrixCount >> 0x1f) & matrixCount)) {
      return 0;
    }
    iVar6 = resultIndices[uVar13];
    if ((firstIndices[uVar13] == iVar6) || (secondIndices[uVar13] == iVar6)) break;
    uVar3 = this->kStateCount;
    pdVar16 = ppdVar4[firstIndices[uVar13]];
    pdVar15 = ppdVar4[secondIndices[uVar13]];
    pdVar5 = ppdVar4[iVar6];
    iVar6 = this->kTransPaddedStateCount * uVar3;
    iVar8 = 0;
    for (uVar10 = 0; uVar10 != (~((int)uVar2 >> 0x1f) & uVar2); uVar10 = uVar10 + 1) {
      for (uVar11 = 0; uVar11 != (~((int)uVar3 >> 0x1f) & uVar3); uVar11 = uVar11 + 1) {
        lVar9 = (long)iVar8;
        pdVar12 = pdVar15;
        for (uVar14 = 0; uVar14 != uVar3; uVar14 = uVar14 + 1) {
          auVar18 = ZEXT816(0) << 0x40;
          uVar7 = 0;
          pdVar17 = pdVar12;
          while (uVar3 != uVar7) {
            auVar19._8_8_ = 0;
            auVar19._0_8_ = pdVar16[(long)(int)(uVar11 * this->kTransPaddedStateCount) + uVar7];
            uVar7 = uVar7 + 1;
            auVar1._8_8_ = 0;
            auVar1._0_8_ = *pdVar17;
            auVar18 = vfmadd231sd_fma(auVar18,auVar19,auVar1);
            pdVar17 = pdVar17 + this->kTransPaddedStateCount;
          }
          pdVar5[lVar9] = auVar18._0_8_;
          lVar9 = lVar9 + 1;
          pdVar12 = pdVar12 + 1;
        }
        pdVar5[(int)lVar9] = 1.0;
        iVar8 = (int)lVar9 + 2;
      }
      pdVar16 = pdVar16 + iVar6;
      pdVar15 = pdVar15 + iVar6;
    }
    uVar13 = uVar13 + 1;
  }
  return -5;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::convolveTransitionMatrices(const int* firstIndices,
        const int* secondIndices,
        const int* resultIndices,
        int matrixCount) {

#ifdef BEAGLE_DEBUG_FLOW
    fprintf(stderr, "\t Entering BeagleCPUImpl::convolveTransitionMatrices \n");
#endif

    int returnCode = BEAGLE_SUCCESS;

    for (int u = 0; u < matrixCount; u++) {

        if(firstIndices[u] == resultIndices[u] || secondIndices[u] == resultIndices[u]) {

#ifdef BEAGLE_DEBUG_FLOW
            fprintf(stderr, "In-place convolution is not allowed \n");
#endif

            returnCode = BEAGLE_ERROR_OUT_OF_RANGE;
            break;

        }//END: overwrite check

        REALTYPE* C = gTransitionMatrices[resultIndices[u]];
        REALTYPE* A = gTransitionMatrices[firstIndices[u]];
        REALTYPE* B = gTransitionMatrices[secondIndices[u]];

        int n = 0;
        for (int l = 0; l < kCategoryCount; l++) {

            for (int i = 0; i < kStateCount; i++) {
                for (int j = 0; j < kStateCount; j++) {

                    REALTYPE sum = 0.0;
                    for (int k = 0; k < kStateCount; k++) {
                        sum += A[k + kTransPaddedStateCount * i] * B[j + kTransPaddedStateCount * k];
                    }
//                  printf("%.30f %.30f %d: \n", C[n], sum, l);
                    C[n] = sum;
                    n++;

                }//END: j loop

                if (T_PAD != 0) {

                    //                      A[n] = 1.0;
                    //                      B[n] = 1.0;
                    C[n] = 1.0;

                    n += T_PAD;

                }//END: padding check

            }//END: i loop

            A += kStateCount * kTransPaddedStateCount;
            B += kStateCount * kTransPaddedStateCount;

        }//END: rates loop

    }//END: u loop

#ifdef BEAGLE_DEBUG_FLOW
    fprintf(stderr, "\t Leaving BeagleCPUImpl::convolveTransitionMatrices \n");
#endif

    return returnCode;
}